

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset_props.cpp
# Opt level: O0

UBool uset_resemblesPattern_63(UChar *pattern,int32_t patternLength,int32_t pos)

{
  UBool UVar1;
  char16_t cVar2;
  int iVar3;
  int32_t iVar4;
  bool local_7b;
  undefined1 local_58 [8];
  UnicodeString pat;
  int32_t pos_local;
  int32_t patternLength_local;
  UChar *pattern_local;
  
  pat.fUnion._48_4_ = pos;
  pat.fUnion._52_4_ = patternLength;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_58,pattern,patternLength);
  iVar3 = pat.fUnion._48_4_ + 1;
  iVar4 = icu_63::UnicodeString::length((UnicodeString *)local_58);
  if (iVar3 < iVar4) {
    cVar2 = icu_63::UnicodeString::charAt((UnicodeString *)local_58,pat.fUnion._48_4_);
    local_7b = true;
    if (cVar2 == L'[') goto LAB_003a0898;
  }
  UVar1 = icu_63::UnicodeSet::resemblesPattern((UnicodeString *)local_58,pat.fUnion._48_4_);
  local_7b = UVar1 != '\0';
LAB_003a0898:
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_58);
  return local_7b;
}

Assistant:

U_CAPI UBool U_EXPORT2
uset_resemblesPattern(const UChar *pattern, int32_t patternLength,
                      int32_t pos) {

    UnicodeString pat(pattern, patternLength);

    return ((pos+1) < pat.length() &&
            pat.charAt(pos) == (UChar)91/*[*/) ||
            UnicodeSet::resemblesPattern(pat, pos);
}